

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::SetTrimTypeFlags(ON_Brep *this,ON_BrepFace *face,bool bLazy)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (face->m_li).m_count;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  bVar3 = true;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    bVar2 = SetTrimTypeFlags(this,(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                                  super_ON_ClassArray<ON_BrepLoop>.m_a + (face->m_li).m_a[uVar5],
                             bLazy);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool
ON_Brep::SetTrimTypeFlags( ON_BrepFace& face, bool bLazy )
{
  bool rc = true;
  int fli;
  const int face_loop_count = face.m_li.Count();
  for ( fli = 0; fli < face_loop_count; fli++ ) {
    if ( !SetTrimTypeFlags( m_L[face.m_li[fli]], bLazy ) )
      rc = false;
  }
  return rc;
}